

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O0

void __thiscall smf::MidiMessage::makeKeySignature(MidiMessage *this,int fifths,bool mode)

{
  reference pvVar1;
  bool mode_local;
  int fifths_local;
  MidiMessage *this_local;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,5);
  pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,0);
  *pvVar1 = 0xff;
  pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,1);
  *pvVar1 = 'Y';
  pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,2);
  *pvVar1 = '\x02';
  pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,3);
  *pvVar1 = (value_type)fifths;
  pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,4);
  *pvVar1 = mode;
  return;
}

Assistant:

void MidiMessage::makeKeySignature(int fifths, bool mode) {
    resize(5);
    (*this)[0] = 0xff;
    (*this)[1] = 0x59;
    (*this)[2] = 0x02;
    (*this)[3] = 0xff & fifths;
    (*this)[4] = 0xff & (int)mode;
}